

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O2

XXH_errorcode VELOCYPACK_XXH3_64bits_reset_withSeed(XXH3_state_t *statePtr,XXH64_hash_t seed)

{
  XXH_errorcode XVar1;
  
  if (statePtr == (XXH3_state_t *)0x0) {
    XVar1 = XXH_ERROR;
  }
  else {
    if (seed == 0) {
      XVar1 = VELOCYPACK_XXH3_64bits_reset(statePtr);
      return XVar1;
    }
    if (statePtr->seed != seed) {
      XXH3_initCustomSecret_sse2(statePtr->customSecret,seed);
    }
    XVar1 = XXH_OK;
    XXH3_reset_internal(statePtr,seed,(void *)0x0,0xc0);
  }
  return XVar1;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode XXH3_64bits_reset_withSeed(XXH3_state_t* statePtr,
                                                        XXH64_hash_t seed) {
  if (statePtr == NULL) return XXH_ERROR;
  if (seed == 0) return XXH3_64bits_reset(statePtr);
  if (seed != statePtr->seed)
    XXH3_initCustomSecret(statePtr->customSecret, seed);
  XXH3_reset_internal(statePtr, seed, NULL, XXH_SECRET_DEFAULT_SIZE);
  return XXH_OK;
}